

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxout.cpp
# Opt level: O0

SPxOut * __thiscall soplex::SPxOut::operator=(SPxOut *this,SPxOut *base)

{
  int i;
  SPxOut *base_local;
  SPxOut *this_local;
  
  if (this != base) {
    this->m_verbosity = base->m_verbosity;
  }
  for (i = 2; i < 6; i = i + 1) {
    this->m_streams[i] = base->m_streams[i];
  }
  return this;
}

Assistant:

SPxOut& SPxOut::operator=(const SPxOut& base)
{
   if(this != &base)
      m_verbosity = base.m_verbosity;

   for(int i = DEBUG; i <= INFO3; ++i)
      m_streams[ i ] = base.m_streams[ i ];

   return *this;
}